

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply_sdf.cpp
# Opt level: O1

void sdf_tools::evaluateAtGridPointsPeriodic(SdfVar *sdfVar,Grid *grid)

{
  undefined8 *puVar1;
  long lVar2;
  anon_class_8_1_898c3844 visitor;
  anon_class_8_1_898c3844 local_8;
  
  lVar2 = (long)(char)(sdfVar->
                      super__Variant_base<sdf_tools::sdf::SdfBox,_sdf_tools::sdf::SdfCapsule,_sdf_tools::sdf::SdfEdges,_sdf_tools::sdf::SdfPiecewisePipe,_sdf_tools::sdf::SdfPlate,_sdf_tools::sdf::SdfSphere,_sdf_tools::sdf::SdfFromMesh>
                      ).
                      super__Move_assign_alias<sdf_tools::sdf::SdfBox,_sdf_tools::sdf::SdfCapsule,_sdf_tools::sdf::SdfEdges,_sdf_tools::sdf::SdfPiecewisePipe,_sdf_tools::sdf::SdfPlate,_sdf_tools::sdf::SdfSphere,_sdf_tools::sdf::SdfFromMesh>
                      .
                      super__Copy_assign_alias<sdf_tools::sdf::SdfBox,_sdf_tools::sdf::SdfCapsule,_sdf_tools::sdf::SdfEdges,_sdf_tools::sdf::SdfPiecewisePipe,_sdf_tools::sdf::SdfPlate,_sdf_tools::sdf::SdfSphere,_sdf_tools::sdf::SdfFromMesh>
                      .
                      super__Move_ctor_alias<sdf_tools::sdf::SdfBox,_sdf_tools::sdf::SdfCapsule,_sdf_tools::sdf::SdfEdges,_sdf_tools::sdf::SdfPiecewisePipe,_sdf_tools::sdf::SdfPlate,_sdf_tools::sdf::SdfSphere,_sdf_tools::sdf::SdfFromMesh>
                      .
                      super__Copy_ctor_alias<sdf_tools::sdf::SdfBox,_sdf_tools::sdf::SdfCapsule,_sdf_tools::sdf::SdfEdges,_sdf_tools::sdf::SdfPiecewisePipe,_sdf_tools::sdf::SdfPlate,_sdf_tools::sdf::SdfSphere,_sdf_tools::sdf::SdfFromMesh>
                      .
                      super__Variant_storage_alias<sdf_tools::sdf::SdfBox,_sdf_tools::sdf::SdfCapsule,_sdf_tools::sdf::SdfEdges,_sdf_tools::sdf::SdfPiecewisePipe,_sdf_tools::sdf::SdfPlate,_sdf_tools::sdf::SdfSphere,_sdf_tools::sdf::SdfFromMesh>
                      ._M_index;
  local_8.grid = grid;
  if (lVar2 != -1) {
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/amlucas[P]sdfTools/src/sdf_tools/core/apply_sdf.cpp:20:20)_&,_const_std::variant<sdf_tools::sdf::SdfBox,_sdf_tools::sdf::SdfCapsule,_sdf_tools::sdf::SdfEdges,_sdf_tools::sdf::SdfPiecewisePipe,_sdf_tools::sdf::SdfPlate,_sdf_tools::sdf::SdfSphere,_sdf_tools::sdf::SdfFromMesh>_&>
      ::_S_vtable._M_arr[lVar2]._M_data)(&local_8,sdfVar);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar1 = &PTR__exception_00151d58;
  puVar1[1] = "std::visit: variant is valueless";
  __cxa_throw(puVar1,&std::bad_variant_access::typeinfo,std::exception::~exception);
}

Assistant:

void evaluateAtGridPointsPeriodic(const sdf::SdfVar& sdfVar, Grid *grid)
{
    auto visitor = [grid](const auto& sdf)
    {
        const real3 extents = grid->getExtents();
        auto applySdfPeriodic = [sdf,extents](real3 r, real& gridValue)
        {
            real s = sdf.at(r);

            for (int dz = -1; dz <= 1; ++dz) {
                for (int dy = -1; dy <= 1; ++dy) {
                    for (int dx = -1; dx <= 1; ++dx) {
                        if (dz == 0 && dy == 0 && dx == 0)
                            continue;

                        const real3 rImage {r.x + dx * extents.x,
                                            r.y + dy * extents.y,
                                            r.z + dz * extents.z};

                        s = sdf::operations::Union{}(s, sdf.at(rImage));
                    }
                }
            }
            gridValue = s;
        };
        gridForEachPoint(applySdfPeriodic, grid);
    };

    std::visit(visitor, sdfVar);
}